

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::SubroutineSymbol_const*,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,std::allocator<std::pair<slang::ast::SubroutineSymbol_const*const,slang::syntax::DPIExportSyntax_const*>>>
::
unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::SubroutineSymbol_const*,slang::syntax::DPIExportSyntax_const*&>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::SubroutineSymbol_const*,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,std::allocator<std::pair<slang::ast::SubroutineSymbol_const*const,slang::syntax::DPIExportSyntax_const*>>>
          *this,size_t hash,try_emplace_args_t *args,SubroutineSymbol **args_1,
          DPIExportSyntax **args_2)

{
  locator local_68;
  arrays_type new_arrays_;
  
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
  ::new_arrays_for_growth
            (&new_arrays_,
             (table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
              *)this);
  __return_storage_ptr__->pg = (group15<boost::unordered::detail::foa::plain_integral> *)0x0;
  __return_storage_ptr__->n = 0;
  __return_storage_ptr__->p =
       (pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*> *)
       0x0;
  nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::SubroutineSymbol_const*,slang::syntax::DPIExportSyntax_const*&>
            (&local_68,this,&new_arrays_,hash >> ((byte)new_arrays_.groups_size_index & 0x3f),hash,
             args,args_1,args_2);
  __return_storage_ptr__->p = local_68.p;
  __return_storage_ptr__->pg = local_68.pg;
  __return_storage_ptr__->n = local_68.n;
  *(undefined4 *)&__return_storage_ptr__->field_0xc = local_68._12_4_;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
  ::unchecked_rehash((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                      *)this,&new_arrays_);
  *(long *)(this + 0x28) = *(long *)(this + 0x28) + 1;
  return __return_storage_ptr__;
}

Assistant:

BOOST_NOINLINE locator unchecked_emplace_with_rehash(std::size_t hash, Args&&... args) {
        auto new_arrays_ = new_arrays_for_growth();
        locator it;
        BOOST_TRY {
            /* strong exception guarantee -> try insertion before rehash */
            it = nosize_unchecked_emplace_at(new_arrays_, position_for(hash, new_arrays_), hash,
                                             std::forward<Args>(args)...);
        }